

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::RecordPublicDependencies
          (DescriptorBuilder *this,FileDescriptor *file)

{
  int iVar1;
  FileDescriptor *pFVar2;
  int i;
  long lVar3;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_bool> pVar4;
  FileDescriptor *local_40;
  FileDescriptor *local_38;
  
  if ((file != (FileDescriptor *)0x0) &&
     (local_40 = file,
     pVar4 = std::
             _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
             ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                       ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                         *)&this->dependencies_,&local_40),
     (local_40 != (FileDescriptor *)0x0 & pVar4.second) == 1)) {
    lVar3 = 0;
    do {
      pFVar2 = local_40;
      if (*(int *)(local_40 + 0x24) <= lVar3) {
        return;
      }
      iVar1 = *(int *)(*(long *)(local_40 + 0x58) + lVar3 * 4);
      if (*(once_flag **)(local_40 + 0x18) != (once_flag *)0x0) {
        local_38 = local_40;
        std::
        call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
                  (*(once_flag **)(local_40 + 0x18),FileDescriptor::DependenciesOnceInit,&local_38);
      }
      RecordPublicDependencies
                (this,*(FileDescriptor **)(*(long *)(pFVar2 + 0x48) + (long)iVar1 * 8));
      lVar3 = lVar3 + 1;
    } while (local_40 != (FileDescriptor *)0x0);
  }
  return;
}

Assistant:

void DescriptorBuilder::RecordPublicDependencies(const FileDescriptor* file) {
  if (file == nullptr || !dependencies_.insert(file).second) return;
  for (int i = 0; file != nullptr && i < file->public_dependency_count(); i++) {
    RecordPublicDependencies(file->public_dependency(i));
  }
}